

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  _xmlAttr *p_Var1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  xmlAttrPtr pxVar6;
  xmlNodePtr pxVar7;
  xmlAttrPtr pxVar8;
  xmlSchemaTreeItemPtr pxVar9;
  xmlSchemaTypePtr attr;
  xmlSchemaParticlePtr item;
  xmlSchemaTreeItemPtr_conflict pxVar10;
  xmlAttrPtr pxVar11;
  xmlSchemaQNameRefPtr pxVar12;
  xmlNodePtr pxVar13;
  xmlChar *pxVar14;
  xmlSchemaTreeItemPtr pxVar15;
  xmlSchemaTypePtr pxVar16;
  xmlSchemaIDCPtr_conflict pxVar17;
  xmlSchemaTypeType idcCategory;
  xmlSchemaTreeItemPtr_conflict pxVar18;
  xmlSchemaTreeItemPtr_conflict pxVar19;
  xmlSchemaBasicItemPtr ownerComp;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr ownerComp_00;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  undefined4 in_register_00000084;
  xmlSchemaTreeItemPtr *ppxVar20;
  char *pcVar21;
  char *in_R9;
  xmlChar **uri;
  xmlSchemaIDCPtr_conflict pxVar22;
  _xmlNode *node_00;
  xmlChar *pxVar23;
  xmlSchemaParserCtxtPtr ctxt_00;
  bool bVar24;
  xmlChar *name;
  xmlChar *ref;
  xmlChar **in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  xmlSchemaParserCtxtPtr pxVar25;
  undefined4 in_stack_ffffffffffffff80;
  xmlAttrPtr local_58;
  uint local_4c;
  xmlNodePtr local_48;
  _xmlNode *local_40;
  xmlNodePtr local_38;
  
  pcVar21 = (char *)CONCAT44(in_register_00000084,topLevel);
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  pxVar13 = (xmlNodePtr)isElemRef;
  pxVar6 = xmlSchemaGetPropNode(node,"name");
  pxVar7 = (xmlNodePtr)xmlSchemaGetPropNode(node,"ref");
  bVar24 = topLevel != 0;
  if (pxVar6 == (xmlAttrPtr)0x0 && (pxVar7 == (xmlNodePtr)0x0 || bVar24)) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1fc067,pxVar13,pcVar21,in_R9);
    return (xmlSchemaBasicItemPtr)0x0;
  }
  pxVar8 = xmlSchemaGetPropNode(node,"id");
  if (pxVar8 != (xmlAttrPtr)0x0) {
    xmlSchemaPValAttrNodeID(ctxt,pxVar8);
  }
  node_00 = node->children;
  if (node_00 == (xmlNodePtr)0x0) {
    node_00 = (xmlNodePtr)0x0;
LAB_001bbc49:
    pxVar9 = (xmlSchemaTreeItemPtr)0x0;
  }
  else {
    if (((node_00->ns == (xmlNs *)0x0) ||
        (iVar3 = xmlStrEqual(node_00->name,"annotation"), iVar3 == 0)) ||
       (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar3 == 0)) goto LAB_001bbc49;
    pxVar9 = (xmlSchemaTreeItemPtr)xmlSchemaParseAnnotation(ctxt,node_00,1);
    node_00 = node_00->next;
  }
  pxVar25 = ctxt;
  if (topLevel == 0) {
    local_48 = node_00;
    local_38 = pxVar7;
    uVar5 = xmlGetMinOccurs(ctxt,node,-1,0x206612,(int)pcVar21,in_R9);
    pcVar21 = "(xs:nonNegativeInteger | unbounded)";
    iVar3 = xmlGetMaxOccurs(ctxt,node,0,0x40000000,0x206628,in_R9);
    xmlSchemaPCheckParticleCorrect_2
              (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar5,iVar3,(int)pcVar21);
    local_4c = uVar5;
    item = xmlSchemaAddParticle(ctxt,node,uVar5,iVar3);
    pxVar13 = local_38;
    if (item == (xmlSchemaParticlePtr)0x0) {
      item = (xmlSchemaParticlePtr)0x0;
    }
    else {
      node_00 = local_48;
      if (pxVar7 == (xmlNodePtr)0x0 || bVar24) goto LAB_001bbc60;
      local_58 = (xmlAttrPtr)0x0;
      local_40 = (_xmlNode *)0x0;
      if (isElemRef != (int *)0x0) {
        *isElemRef = 1;
      }
      pxVar11 = (xmlAttrPtr)xmlSchemaGetNodeContent(pxVar25,local_38);
      pxVar8 = (xmlAttrPtr)&stack0xffffffffffffffa8;
      uri = (xmlChar **)&stack0xffffffffffffffc0;
      xmlSchemaPValAttrNodeQNameValue
                (pxVar25,schema,(xmlSchemaBasicItemPtr)pxVar13,pxVar11,(xmlChar *)pxVar8,uri,
                 in_stack_ffffffffffffff68);
      pxVar11 = local_58;
      xmlSchemaCheckReference(pxVar25,(xmlSchemaPtr)node,pxVar13,local_58,(xmlChar *)pxVar8);
      if (pxVar6 != (xmlAttrPtr)0x0) {
        pxVar8 = (xmlAttrPtr)0x1ff71c;
        uri = (xmlChar **)0x1fc067;
        xmlSchemaPMutualExclAttrErr
                  (pxVar25,XML_SCHEMAP_SRC_ELEMENT_2_1,(xmlSchemaBasicItemPtr)0x0,pxVar6,"ref",
                   "name");
      }
      for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
        if (p_Var1->ns == (xmlNs *)0x0) {
          iVar4 = xmlStrEqual(p_Var1->name,"ref");
          if (((iVar4 == 0) && (iVar4 = xmlStrEqual(p_Var1->name,"name"), iVar4 == 0)) &&
             ((iVar4 = xmlStrEqual(p_Var1->name,"id"), iVar4 == 0 &&
              ((iVar4 = xmlStrEqual(p_Var1->name,(xmlChar *)"maxOccurs"), iVar4 == 0 &&
               (iVar4 = xmlStrEqual(p_Var1->name,(xmlChar *)"minOccurs"), iVar4 == 0)))))) {
            xmlSchemaPCustomAttrErr
                      (pxVar25,XML_SCHEMAP_SRC_ELEMENT_2_2,(xmlChar **)p_Var1,
                       (xmlSchemaBasicItemPtr)
                       "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                       ,pxVar8,(char *)uri);
            break;
          }
        }
        else {
          iVar4 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          if (iVar4 != 0) {
            xmlSchemaPIllegalAttrErr(pxVar25,(xmlParserErrors)p_Var1,ownerComp,pxVar6);
          }
        }
      }
      if (local_48 != (xmlNodePtr)0x0) {
        xmlSchemaPContentErr
                  (pxVar25,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,local_48,
                   (xmlNodePtr)0x0,"(annotation?)",(char *)in_stack_ffffffffffffff68);
      }
      if ((iVar3 != 0 || local_4c != 0) &&
         (pxVar12 = xmlSchemaNewQNameRef
                              (pxVar25,XML_SCHEMA_TYPE_ELEMENT,(xmlChar *)local_40,
                               (xmlChar *)pxVar11), pxVar12 != (xmlSchemaQNameRefPtr)0x0)) {
        item->children = (xmlSchemaTreeItemPtr_conflict)pxVar12;
        item->annot = (xmlSchemaAnnotPtr)pxVar9;
        xmlSchemaAddItemSize(&pxVar25->constructor->pending,10,item);
        return (xmlSchemaBasicItemPtr)item;
      }
    }
    pxVar10 = (xmlSchemaTreeItemPtr_conflict)0x0;
    goto LAB_001bc765;
  }
  item = (xmlSchemaParticlePtr)0x0;
LAB_001bbc60:
  ctxt_00 = pxVar25;
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  pxVar16 = (xmlSchemaTypePtr)&stack0xffffffffffffffa8;
  iVar4 = xmlSchemaPValAttrNode
                    (pxVar25,(xmlSchemaBasicItemPtr)pxVar6,(xmlAttrPtr)attr,pxVar16,
                     (xmlChar **)pcVar21);
  iVar3 = 3;
  if (iVar4 == 0) {
    if (topLevel == 0) {
      pxVar13 = (xmlNodePtr)xmlSchemaGetPropNode(node,"form");
      if (pxVar13 == (xmlNodePtr)0x0) {
        if ((schema->flags & 1) != 0) goto LAB_001bbd45;
LAB_001bc549:
        pxVar23 = (xmlChar *)0x0;
      }
      else {
        pxVar14 = xmlSchemaGetNodeContent(pxVar25,pxVar13);
        iVar4 = xmlStrEqual(pxVar14,"qualified");
        if (iVar4 != 0) goto LAB_001bbd45;
        iVar4 = xmlStrEqual(pxVar14,(xmlChar *)"unqualified");
        if (iVar4 != 0) goto LAB_001bc549;
        in_stack_ffffffffffffff68 = (xmlChar **)0x0;
        in_stack_ffffffffffffff70 = 0;
        pxVar23 = (xmlChar *)0x0;
        pxVar16 = (xmlSchemaTypePtr)0x0;
        xmlSchemaPSimpleTypeErr
                  (ctxt_00,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar13,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)pxVar14,
                   (xmlChar *)0x0,(char *)0x0,(xmlChar *)ctxt_00,
                   (xmlChar *)CONCAT44(topLevel,in_stack_ffffffffffffff80));
      }
    }
    else {
LAB_001bbd45:
      pxVar23 = pxVar25->targetNamespace;
    }
    pxVar6 = local_58;
    if (local_58 == (xmlAttrPtr)0x0) {
      pxVar10 = (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    else {
      pxVar10 = (xmlSchemaTreeItemPtr_conflict)(*xmlMalloc)(200);
      if (pxVar10 == (xmlSchemaTreeItemPtr_conflict)0x0) {
        if (ctxt_00 != (xmlSchemaParserCtxtPtr)0x0) {
          ctxt_00->nberrors = ctxt_00->nberrors + 1;
        }
        pxVar16 = (xmlSchemaTypePtr)0x0;
        __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating element");
        pxVar10 = (xmlSchemaTreeItemPtr_conflict)0x0;
      }
      else {
        memset(pxVar10,0,200);
        pxVar10->type = XML_SCHEMA_TYPE_ELEMENT;
        pxVar10->next = (xmlSchemaTreeItemPtr)pxVar6;
        *(xmlChar **)(pxVar10 + 3) = pxVar23;
        pxVar10[2].annot = (xmlSchemaAnnotPtr)node;
        pxVar16 = (xmlSchemaTypePtr)ctxt_00->constructor->bucket;
        xmlSchemaAddItemSize
                  ((xmlSchemaItemListPtr *)(&pxVar16->attributes + (topLevel == 0)),
                   (uint)(topLevel == 0) * 5 + 5,pxVar10);
        xmlSchemaAddItemSize(&ctxt_00->constructor->pending,10,pxVar10);
      }
    }
    iVar4 = (int)in_stack_ffffffffffffff70;
    if (pxVar10 == (xmlSchemaTreeItemPtr_conflict)0x0) {
      pxVar10 = (xmlSchemaTreeItemPtr_conflict)0x0;
    }
    else {
      for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
        if (p_Var1->ns == (xmlNs *)0x0) {
          iVar3 = xmlStrEqual(p_Var1->name,"name");
          if ((((((iVar3 == 0) && (iVar3 = xmlStrEqual(p_Var1->name,"type"), iVar3 == 0)) &&
                (iVar3 = xmlStrEqual(p_Var1->name,"id"), iVar3 == 0)) &&
               ((iVar3 = xmlStrEqual(p_Var1->name,"default"), iVar3 == 0 &&
                (iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"fixed"), iVar3 == 0)))) &&
              (iVar3 = xmlStrEqual(p_Var1->name,"block"), iVar3 == 0)) &&
             (iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"nillable"), iVar3 == 0)) {
            if (topLevel == 0) {
              iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"maxOccurs");
              if ((iVar3 == 0) &&
                 (iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"minOccurs"), iVar3 == 0)) {
                pxVar14 = p_Var1->name;
                pcVar21 = "form";
                goto LAB_001bc1ce;
              }
            }
            else {
              iVar3 = xmlStrEqual(p_Var1->name,(xmlChar *)"final");
              if ((iVar3 == 0) && (iVar3 = xmlStrEqual(p_Var1->name,"abstract"), iVar3 == 0)) {
                pxVar14 = p_Var1->name;
                pcVar21 = "substitutionGroup";
LAB_001bc1ce:
                iVar3 = xmlStrEqual(pxVar14,(xmlChar *)pcVar21);
                ownerComp_00 = extraout_RDX_00;
                if (iVar3 == 0) goto LAB_001bc0ac;
              }
            }
          }
        }
        else {
          iVar3 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          ownerComp_00 = extraout_RDX;
          if (iVar3 != 0) {
LAB_001bc0ac:
            xmlSchemaPIllegalAttrErr
                      (ctxt_00,(xmlParserErrors)p_Var1,ownerComp_00,(xmlAttrPtr)pxVar16);
          }
        }
        iVar4 = (int)in_stack_ffffffffffffff70;
      }
      pxVar18 = pxVar10;
      if (topLevel != 0) {
        *(byte *)&pxVar10[2].children = *(byte *)&pxVar10[2].children | 0x22;
        ppxVar20 = &pxVar10[2].children;
        iVar3 = 0x207075;
        xmlSchemaPValAttrQName
                  (ctxt_00,schema,(xmlSchemaBasicItemPtr)node,(xmlNodePtr)"substitutionGroup",
                   (char *)(pxVar10 + 4),(xmlChar **)&pxVar10[3].children,in_stack_ffffffffffffff68)
        ;
        iVar3 = xmlGetBooleanProp(ctxt_00,node,"abstract",iVar3);
        if (iVar3 != 0) {
          *(byte *)ppxVar20 = *(byte *)ppxVar20 | 0x10;
        }
        pxVar13 = (xmlNodePtr)xmlSchemaGetPropNode(node,"final");
        if (pxVar13 == (xmlNodePtr)0x0) {
          uVar5 = schema->flags;
          if ((uVar5 & 4) != 0) {
            puVar2 = (undefined1 *)((long)&pxVar10[2].children + 1);
            *puVar2 = *puVar2 | 0x80;
          }
          if ((uVar5 & 8) != 0) {
            puVar2 = (undefined1 *)((long)&pxVar10[2].children + 2);
            *puVar2 = *puVar2 | 1;
          }
        }
        else {
          pxVar14 = xmlSchemaGetNodeContent(ctxt_00,pxVar13);
          in_stack_ffffffffffffff68 =
               (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
          iVar3 = xmlSchemaPValAttrBlockFinal(pxVar14,(int *)ppxVar20,0x8000,0x10000,-1,-1,-1,iVar4)
          ;
          if (iVar3 != 0) {
            in_stack_ffffffffffffff68 = (xmlChar **)0x0;
            iVar4 = 0;
            xmlSchemaPSimpleTypeErr
                      (ctxt_00,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar13,
                       (xmlNodePtr)0x0,
                       (xmlSchemaTypePtr)"(#all | List of (extension | restriction))",
                       (char *)pxVar14,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar18,
                       (xmlChar *)CONCAT44(topLevel,in_stack_ffffffffffffff80));
          }
        }
      }
      pxVar13 = (xmlNodePtr)xmlSchemaGetPropNode(node,"block");
      pxVar19 = pxVar18;
      if (pxVar13 == (xmlNodePtr)0x0) {
        uVar5 = schema->flags;
        if ((char)uVar5 < '\0') {
          puVar2 = (undefined1 *)((long)&pxVar18[2].children + 1);
          *puVar2 = *puVar2 | 0x10;
        }
        if ((uVar5 & 0x40) != 0) {
          puVar2 = (undefined1 *)((long)&pxVar18[2].children + 1);
          *puVar2 = *puVar2 | 8;
        }
        if ((uVar5 >> 8 & 1) != 0) {
          puVar2 = (undefined1 *)((long)&pxVar18[2].children + 1);
          *puVar2 = *puVar2 | 0x20;
        }
      }
      else {
        pxVar14 = xmlSchemaGetNodeContent(ctxt_00,pxVar13);
        in_stack_ffffffffffffff68 =
             (xmlChar **)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),0xffffffff);
        pxVar18 = (xmlSchemaTreeItemPtr_conflict)0x1000;
        iVar3 = xmlSchemaPValAttrBlockFinal
                          (pxVar14,(int *)&pxVar19[2].children,0x800,0x1000,0x2000,-1,-1,iVar4);
        if (iVar3 != 0) {
          in_stack_ffffffffffffff68 = (xmlChar **)0x0;
          pxVar18 = (xmlSchemaTreeItemPtr_conflict)0x0;
          xmlSchemaPSimpleTypeErr
                    (ctxt_00,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar13,
                     (xmlNodePtr)0x0,
                     (xmlSchemaTypePtr)"(#all | List of (extension | restriction | substitution))",
                     (char *)pxVar14,(xmlChar *)0x0,(char *)0x0,(xmlChar *)pxVar19,
                     (xmlChar *)CONCAT44(topLevel,in_stack_ffffffffffffff80));
        }
      }
      iVar3 = xmlGetBooleanProp(ctxt_00,node,"nillable",(int)pxVar18);
      if (iVar3 != 0) {
        *(byte *)&pxVar19[2].children = *(byte *)&pxVar19[2].children | 1;
      }
      pxVar13 = (xmlNodePtr)xmlSchemaGetPropNode(node,"type");
      pxVar10 = pxVar19;
      if (pxVar13 != (xmlNodePtr)0x0) {
        ppxVar20 = &pxVar19[3].next;
        pxVar6 = (xmlAttrPtr)xmlSchemaGetNodeContent(ctxt_00,pxVar13);
        xmlSchemaPValAttrNodeQNameValue
                  (ctxt_00,schema,(xmlSchemaBasicItemPtr)pxVar13,pxVar6,(xmlChar *)ppxVar20,
                   (xmlChar **)&pxVar19[3].annot,in_stack_ffffffffffffff68);
        xmlSchemaCheckReference
                  (ctxt_00,(xmlSchemaPtr)node,pxVar13,(xmlAttrPtr)pxVar19[3].next,
                   (xmlChar *)ppxVar20);
      }
      pxVar15 = (xmlSchemaTreeItemPtr)xmlSchemaGetProp(ctxt_00,node,"default");
      pxVar19[4].next = pxVar15;
      pxVar13 = (xmlNodePtr)xmlSchemaGetPropNode(node,"fixed");
      if (pxVar13 != (xmlNodePtr)0x0) {
        pxVar15 = (xmlSchemaTreeItemPtr)xmlSchemaGetNodeContent(ctxt_00,pxVar13);
        if (pxVar10[4].next == (xmlSchemaTreeItemPtr)0x0) {
          *(byte *)&pxVar10[2].children = *(byte *)&pxVar10[2].children | 8;
          pxVar10[4].next = pxVar15;
        }
        else {
          xmlSchemaPMutualExclAttrErr
                    (ctxt_00,XML_SCHEMAP_SRC_ELEMENT_1,(xmlSchemaBasicItemPtr)0x0,
                     (xmlAttrPtr)pxVar13,"default","fixed");
        }
      }
      if (node_00 == (xmlNodePtr)0x0) {
        node_00 = (xmlNodePtr)0x0;
      }
      else if (((node_00->ns == (xmlNs *)0x0) ||
               (iVar3 = xmlStrEqual(node_00->name,(xmlChar *)"complexType"), iVar3 == 0)) ||
              (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar3 == 0)) {
        if (((node_00->ns != (xmlNs *)0x0) &&
            (iVar3 = xmlStrEqual(node_00->name,"simpleType"), iVar3 != 0)) &&
           (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar3 != 0)) {
          if (pxVar10[3].annot == (xmlSchemaAnnotPtr)0x0) {
            pxVar18 = pxVar10;
            pxVar16 = xmlSchemaParseSimpleType(ctxt_00,schema,node_00,0);
            goto LAB_001bc577;
          }
          pcVar21 = "The attribute \'type\' and the <simpleType> child are mutually exclusive";
          goto LAB_001bc51d;
        }
      }
      else {
        if (pxVar10[3].annot == (xmlSchemaAnnotPtr)0x0) {
          pxVar18 = pxVar10;
          pxVar16 = xmlSchemaParseComplexType(ctxt_00,schema,node_00,0);
LAB_001bc577:
          pxVar10[1].children = (xmlSchemaTreeItemPtr)pxVar16;
          pxVar10 = pxVar18;
        }
        else {
          pcVar21 = "The attribute \'type\' and the <complexType> child are mutually exclusive";
LAB_001bc51d:
          xmlSchemaPContentErr
                    (ctxt_00,XML_SCHEMAP_SRC_ELEMENT_3,(xmlSchemaBasicItemPtr)node,node_00,
                     (xmlNodePtr)pcVar21,(char *)0x0,(char *)in_stack_ffffffffffffff68);
        }
        node_00 = node_00->next;
      }
      if (node_00 != (xmlNodePtr)0x0) {
        pxVar18 = pxVar10 + 6;
        pxVar22 = (xmlSchemaIDCPtr_conflict)0x0;
        do {
          if (((((node_00->ns == (xmlNs *)0x0) ||
                (iVar3 = xmlStrEqual(node_00->name,(xmlChar *)"unique"), iVar3 == 0)) ||
               (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar3 == 0)) &&
              (((node_00->ns == (xmlNs *)0x0 ||
                (iVar3 = xmlStrEqual(node_00->name,"key"), iVar3 == 0)) ||
               (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar3 == 0)))) &&
             (((node_00->ns == (xmlNs *)0x0 ||
               (iVar3 = xmlStrEqual(node_00->name,"keyref"), iVar3 == 0)) ||
              (iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar3 == 0)))) {
            xmlSchemaPContentErr
                      (ctxt_00,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
                       (xmlNodePtr)0x0,
                       "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))",
                       (char *)in_stack_ffffffffffffff68);
            break;
          }
          if ((node_00->ns == (xmlNs *)0x0) ||
             (iVar3 = xmlStrEqual(node_00->name,(xmlChar *)"unique"), iVar3 == 0)) {
LAB_001bc66b:
            if ((node_00->ns != (xmlNs *)0x0) &&
               (iVar3 = xmlStrEqual(node_00->name,"key"), iVar3 != 0)) {
              iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              idcCategory = XML_SCHEMA_TYPE_IDC_KEY;
              if (iVar3 != 0) goto LAB_001bc6e0;
            }
            pxVar17 = pxVar22;
            if ((node_00->ns != (xmlNs *)0x0) &&
               (iVar3 = xmlStrEqual(node_00->name,"keyref"), iVar3 != 0)) {
              iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              idcCategory = XML_SCHEMA_TYPE_IDC_KEYREF;
              if (iVar3 != 0) goto LAB_001bc6e0;
            }
          }
          else {
            iVar3 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            idcCategory = XML_SCHEMA_TYPE_IDC_UNIQUE;
            if (iVar3 == 0) goto LAB_001bc66b;
LAB_001bc6e0:
            pxVar17 = xmlSchemaParseIDC(ctxt_00,schema,node_00,idcCategory,
                                        *(xmlChar **)(pxVar10 + 3));
          }
          pxVar19 = (xmlSchemaTreeItemPtr_conflict)&pxVar22->next;
          if (pxVar22 == (xmlSchemaIDCPtr_conflict)0x0) {
            pxVar19 = pxVar18;
          }
          *(xmlSchemaIDCPtr_conflict *)pxVar19 = pxVar17;
          node_00 = node_00->next;
          pxVar22 = pxVar17;
        } while (node_00 != (_xmlNode *)0x0);
      }
      pxVar10[1].next = pxVar9;
      iVar3 = 0;
    }
  }
  else {
    pxVar10 = (xmlSchemaTreeItemPtr_conflict)0x0;
    iVar3 = 3;
  }
  if (iVar3 != 3) {
    if (iVar3 != 0) {
      return (xmlSchemaBasicItemPtr)item;
    }
    if (topLevel != 0) {
      return (xmlSchemaBasicItemPtr)pxVar10;
    }
    item->children = pxVar10;
    return (xmlSchemaBasicItemPtr)item;
  }
LAB_001bc765:
  if (pxVar9 != (xmlSchemaTreeItemPtr)0x0) {
    if (item != (xmlSchemaParticlePtr)0x0) {
      item->annot = (xmlSchemaAnnotPtr)0x0;
    }
    if (pxVar10 != (xmlSchemaTreeItemPtr_conflict)0x0) {
      pxVar10[1].next = (xmlSchemaTreeItemPtr)0x0;
    }
    if (*(_xmlSchemaAnnot **)&pxVar9->type != (_xmlSchemaAnnot *)0x0) {
      do {
        pxVar15 = *(xmlSchemaTreeItemPtr *)&pxVar9->type;
        (*xmlFree)(pxVar9);
        pxVar9 = pxVar15;
      } while (pxVar15 != (xmlSchemaTreeItemPtr)0x0);
      return (xmlSchemaBasicItemPtr)0x0;
    }
    (*xmlFree)(pxVar9);
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}